

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O1

int __thiscall String::compare(String *this,String *other)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  byte bVar4;
  long lVar5;
  
  pbVar1 = (byte *)operator_cast_to_char_(this);
  pbVar2 = (byte *)operator_cast_to_char_(other);
  bVar3 = *pbVar1;
  bVar4 = *pbVar2;
  if (bVar3 == bVar4) {
    lVar5 = 1;
    do {
      if (bVar3 == 0) {
        return 0;
      }
      bVar3 = pbVar1[lVar5];
      bVar4 = pbVar2[lVar5];
      lVar5 = lVar5 + 1;
    } while (bVar3 == bVar4);
  }
  return (uint)bVar3 - (uint)bVar4;
}

Assistant:

int compare(const String& other) const
  {
    const char* s1 = *this, * s2 = other;
    for(; *s1 == *s2; ++s1, ++s2)
      if(!*s1)
        return 0;
    return (int)*(const uchar*)s1 - *(const uchar*)s2;

  }